

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandRecMerge3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  Gia_Man_t *pLib;
  int iVar3;
  char *pcVar4;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"dh");
  if (iVar1 != -1) {
    iVar1 = -2;
    Abc_Print(-2,"usage: rec_merge3 [-h] <file>\n");
    Abc_Print(-2,"\t         merge libraries\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pcVar4 = "\t<file> : AIGER file with the library\n";
LAB_0023193d:
    Abc_Print(iVar1,pcVar4);
    return 1;
  }
  iVar1 = Abc_NtkRecIsRunning3();
  if (iVar1 != 0) {
    if (argc - globalUtilOptind == 1) {
      pcVar4 = argv[globalUtilOptind];
      pcVar2 = pcVar4;
      do {
        if (*pcVar2 == '>') {
          *pcVar2 = '\\';
        }
        else if (*pcVar2 == '\0') goto LAB_002319a2;
        pcVar2 = pcVar2 + 1;
      } while( true );
    }
    pcVar4 = "File name is not given on the command line.\n";
    iVar1 = -1;
    goto LAB_0023193d;
  }
  pcVar4 = "This command works for AIGs only after calling \"rec_start3\".\n";
  goto LAB_0023198e;
LAB_002319a2:
  __stream = fopen(pcVar4,"r");
  if (__stream == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar4);
    pcVar4 = Extra_FileGetSimilarName(pcVar4,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0)
    ;
    if (pcVar4 != (char *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
    }
    pcVar4 = "\n";
    iVar1 = 1;
    iVar3 = iVar1;
    goto LAB_00231a3b;
  }
  fclose(__stream);
  pLib = Gia_AigerRead(pcVar4,0,1,0);
  if (pLib != (Gia_Man_t *)0x0) {
    Abc_NtkRecLibMerge3(pLib);
    Gia_ManStop(pLib);
    return 0;
  }
  pcVar4 = "Reading AIGER has failed.\n";
LAB_0023198e:
  iVar1 = -1;
  iVar3 = 0;
LAB_00231a3b:
  Abc_Print(iVar1,pcVar4);
  return iVar3;
}

Assistant:

int Abc_CommandRecMerge3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int nArgcNew;
    FILE * pFile;
    Gia_Man_t * pGia = NULL;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "This command works for AIGs only after calling \"rec_start3\".\n" );
        return 0;
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "File name is not given on the command line.\n" );
        return 1;
    }
    else
    {
        // get the input file name
        FileName = pArgvNew[0];
        // fix the wrong symbol
        for ( pTemp = FileName; *pTemp; pTemp++ )
            if ( *pTemp == '>' )
                *pTemp = '\\';
        if ( (pFile = fopen( FileName, "r" )) == NULL )
        {
            Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
            if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                Abc_Print( 1, "Did you mean \"%s\"?", FileName );
            Abc_Print( 1, "\n" );
            return 1;
        }
        fclose( pFile );
        pGia = Gia_AigerRead( FileName, 0, 1, 0 );
        if ( pGia == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
    }
    Abc_NtkRecLibMerge3(pGia);
    Gia_ManStop( pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: rec_merge3 [-h] <file>\n" );
    Abc_Print( -2, "\t         merge libraries\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : AIGER file with the library\n");
    return 1;
}